

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O1

iterator __thiscall
BCLog::Logger::PushBackCallback
          (Logger *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          fun)

{
  long lVar1;
  _List_node_base *p_Var2;
  int iVar3;
  undefined8 uVar4;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    std::__cxx11::
    list<std::function<void(std::__cxx11::string_const&)>,std::allocator<std::function<void(std::__cxx11::string_const&)>>>
    ::_M_insert<std::function<void(std::__cxx11::string_const&)>>
              ((list<std::function<void(std::__cxx11::string_const&)>,std::allocator<std::function<void(std::__cxx11::string_const&)>>>
                *)&this->m_print_callbacks,(iterator)&this->m_print_callbacks,in_RSI);
    p_Var2 = (this->m_print_callbacks).
             super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return (iterator)p_Var2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar4 = std::__throw_system_error(iVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pthread_mutex_unlock((pthread_mutex_t *)this);
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_cs)
        {
            StdLockGuard scoped_lock(m_cs);
            m_print_callbacks.push_back(std::move(fun));
            return --m_print_callbacks.end();
        }